

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void phmap::priv::
     InitializerListBucketAllocTest<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
               (void)

{
  Generator<std::pair<const_int,_int>,_void> *this;
  _Head_base<0UL,_unsigned_long,_false> *this_00;
  initializer_list<std::pair<const_int,_int>_> iVar1;
  bool bVar2;
  char *pcVar3;
  Alloc<std::pair<const_int,_int>_> *lhs;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  initializer_list<std::pair<const_int,_int>_> xs;
  AssertHelper local_5e0;
  Message local_5d8;
  int local_5cc;
  size_t local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_2;
  Message local_5a8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_5a0;
  iterator local_588;
  iterator ppStack_580;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_> local_570;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>_>
  local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_1;
  Message local_518;
  undefined1 local_510 [8];
  undefined1 local_508 [8];
  AssertionResult gtest_ar;
  undefined1 local_4d0 [8];
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  m;
  A alloc;
  initializer_list<std::pair<const_int,_int>_> values;
  Generator<std::pair<const_int,_int>,_void> gen;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_> *matcher;
  
  this = (Generator<std::pair<const_int,_int>,_void> *)((long)&values._M_len + 6);
  alloc.id_ = (size_t)hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this);
  values._M_array = (iterator)0x5;
  this_00 = (_Head_base<0UL,_unsigned_long,_false> *)
            ((long)&m.
                    super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                    .
                    super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                    .sets_._M_elems[0xf].set_.settings_ + 0x18);
  Alloc<std::pair<const_int,_int>_>::Alloc((Alloc<std::pair<const_int,_int>_> *)this_00,0);
  iVar1._M_len = (size_type)values._M_array;
  iVar1._M_array = (iterator)&alloc;
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
                       *)local_4d0,iVar1,0x7b,(allocator_type *)this_00);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::get_allocator((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                   *)local_510);
  lhs = (Alloc<std::pair<const_int,_int>_> *)local_510;
  testing::internal::EqHelper::
  Compare<phmap::priv::Alloc<std::pair<const_int,_int>_>,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_nullptr>
            ((EqHelper *)local_508,"m.get_allocator()","alloc",lhs,
             (Alloc<std::pair<const_int,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18));
  Alloc<std::pair<const_int,_int>_>::~Alloc((Alloc<std::pair<const_int,_int>_> *)local_510);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar2) {
    testing::Message::Message(&local_518);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    lhs = (Alloc<std::pair<const_int,_int>_> *)0x16a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x16a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  ppStack_580 = values._M_array;
  xs._M_len = (size_type)lhs;
  xs._M_array = values._M_array;
  local_588 = (iterator)&alloc;
  testing::UnorderedElementsAreArray<std::pair<int_const,int>>(&local_570,(testing *)&alloc,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
            (&local_550,(internal *)&local_570,matcher);
  items<phmap::parallel_flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>,4ul,phmap::NullMutex>>
            (&local_5a0,(priv *)local_4d0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(local_530,(char *)&local_550,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_5a0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_550);
  testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_570);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar2) {
    testing::Message::Message(&local_5a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_5a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  local_5c8 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
              ::bucket_count((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                              *)local_4d0);
  local_5cc = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_5c0,"m.bucket_count()","123",&local_5c8,&local_5cc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar2) {
    testing::Message::Message(&local_5d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x16c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>
              *)local_4d0);
  Alloc<std::pair<const_int,_int>_>::~Alloc
            ((Alloc<std::pair<const_int,_int>_> *)
             ((long)&m.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     .sets_._M_elems[0xf].set_.settings_ + 0x18));
  return;
}

Assistant:

void InitializerListBucketAllocTest(std::true_type) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using A = typename TypeParam::allocator_type;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  A alloc(0);
  TypeParam m(values, 123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_GE(m.bucket_count(), 123);
}